

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StableBlockVector.hpp
# Opt level: O1

void __thiscall
gmlc::containers::StableBlockVector<helics::Translator,_5U,_std::allocator<helics::Translator>_>::
freeAll(StableBlockVector<helics::Translator,_5U,_std::allocator<helics::Translator>_> *this)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  
  if (this->dataptr != (Translator **)0x0) {
    lVar3 = (long)this->bsize;
    if (0 < lVar3) {
      lVar4 = lVar3 + 1;
      lVar3 = lVar3 * 0x50;
      do {
        (*(code *)**(undefined8 **)
                    ((long)&this->dataptr[this->dataSlotIndex][-1].super_Interface._vptr_Interface +
                    lVar3))((long)&this->dataptr[this->dataSlotIndex][-1].super_Interface.
                                   _vptr_Interface + lVar3);
        lVar4 = lVar4 + -1;
        lVar3 = lVar3 + -0x50;
      } while (1 < lVar4);
    }
    if (0 < (long)this->dataSlotIndex) {
      operator_delete(this->dataptr[this->dataSlotIndex],0xa00);
    }
    lVar3 = (long)this->dataSlotIndex;
    if (0 < (long)this->dataSlotIndex) {
      do {
        lVar4 = lVar3 + -1;
        lVar2 = 0x9b0;
        do {
          (*(code *)**(undefined8 **)
                      ((long)&(this->dataptr[lVar4]->super_Interface)._vptr_Interface + lVar2))
                    ((long)&(this->dataptr[lVar4]->super_Interface)._vptr_Interface + lVar2);
          lVar2 = lVar2 + -0x50;
        } while (lVar2 != -0x50);
        operator_delete(this->dataptr[lVar4],0xa00);
        bVar1 = 1 < lVar3;
        lVar3 = lVar4;
      } while (bVar1);
    }
    if (this->dataSlotIndex == 0) {
      operator_delete(*this->dataptr,0xa00);
    }
    if (0 < this->freeIndex) {
      lVar3 = 0;
      do {
        operator_delete(this->freeblocks[lVar3],0xa00);
        lVar3 = lVar3 + 1;
      } while (lVar3 < this->freeIndex);
    }
    if (this->freeblocks != (Translator **)0x0) {
      operator_delete__(this->freeblocks);
    }
    if (this->dataptr != (Translator **)0x0) {
      operator_delete__(this->dataptr);
      return;
    }
  }
  return;
}

Assistant:

void freeAll()
        {
            if (dataptr != nullptr) {
                Allocator a;
                for (int jj = bsize - 1; jj >= 0;
                     --jj) {  // call destructors on the last block
                    dataptr[dataSlotIndex][jj].~X();
                }
                if (dataSlotIndex > 0) {
                    a.deallocate(dataptr[dataSlotIndex], blockSize);
                }
                // go in reverse order
                for (int ii = dataSlotIndex - 1; ii >= 0; --ii) {
                    for (int jj = blockSize - 1; jj >= 0;
                         --jj) {  // call destructors on the middle blocks
                        dataptr[ii][jj].~X();
                    }
                    a.deallocate(dataptr[ii], blockSize);
                }
                if (dataSlotIndex == 0) {
                    a.deallocate(dataptr[0], blockSize);
                }

                for (int ii = 0; ii < freeIndex; ++ii) {
                    a.deallocate(freeblocks[ii], blockSize);
                }
                // delete can handle a nullptr
                delete[] freeblocks;
                delete[] dataptr;
            }
        }